

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-https-connect.c
# Opt level: O1

CURLcode cf_hc_connect(Curl_cfilter *cf,Curl_easy *data,_Bool *done)

{
  CURLcode *pCVar1;
  Curl_cfilter *pCVar2;
  Curl_cfilter *pCVar3;
  void *pvVar4;
  long *plVar5;
  curl_trc_feat *pcVar6;
  CURLcode CVar7;
  timediff_t tVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  cf_hc_baller *winner;
  CURLcode *pCVar11;
  CURLcode CVar12;
  undefined8 uVar13;
  curltime cVar14;
  curltime newer;
  
  if ((cf->field_0x24 & 1) != 0) {
    *done = true;
    return CURLE_OK;
  }
  pCVar1 = (CURLcode *)cf->ctx;
  *done = false;
  cVar14 = Curl_now();
  CVar12 = CURLE_OK;
  switch(*pCVar1) {
  case CURLE_OK:
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
      pcVar6 = (data->state).feat;
      if (pcVar6 == (curl_trc_feat *)0x0) {
        if (cf != (Curl_cfilter *)0x0) goto LAB_00114de8;
      }
      else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar6->log_level)) {
LAB_00114de8:
        if (0 < cf->cft->log_level) {
          Curl_trc_cf_infof(data,cf,"connect, init");
        }
      }
    }
    *(time_t *)(pCVar1 + 4) = cVar14.tv_sec;
    pCVar1[6] = cVar14.tv_usec;
    cf_hc_baller_init((cf_hc_baller *)(pCVar1 + 10),cf,data,(uint)cf->conn->transport);
    if (((CURLE_UNSUPPORTED_PROTOCOL < (ulong)*(undefined8 *)(pCVar1 + 0x26)) &&
        (Curl_expire(data,(ulong)pCVar1[0x28],EXPIRE_ALPN_EYEBALLS), data != (Curl_easy *)0x0)) &&
       (((data->set).field_0x89f & 0x40) != 0)) {
      pcVar6 = (data->state).feat;
      if (pcVar6 == (curl_trc_feat *)0x0) {
        if (cf != (Curl_cfilter *)0x0) goto LAB_00114e7d;
      }
      else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar6->log_level)) {
LAB_00114e7d:
        if (0 < cf->cft->log_level) {
          Curl_trc_cf_infof(data,cf,"set next attempt to start in %ums");
        }
      }
    }
    *pCVar1 = CURLE_UNSUPPORTED_PROTOCOL;
  case CURLE_UNSUPPORTED_PROTOCOL:
    pCVar2 = *(Curl_cfilter **)(pCVar1 + 0xc);
    CVar7 = CURLE_OK;
    if ((pCVar2 == (Curl_cfilter *)0x0) || (pCVar1[0xe] != CURLE_OK)) {
LAB_00114f18:
      pvVar4 = cf->ctx;
      if ((*(ulong *)((long)pvVar4 + 0x98) < 2) || (*(long *)((long)pvVar4 + 0x68) != 0))
      goto LAB_001150c4;
      if (*(int *)((long)pvVar4 + 0x38) == 0) {
        newer._12_4_ = 0;
        newer.tv_sec = SUB128(cVar14._0_12_,0);
        newer.tv_usec = SUB124(cVar14._0_12_,8);
        cVar14._12_4_ = 0;
        cVar14._0_12_ = *(undefined1 (*) [12])((long)pvVar4 + 0x10);
        tVar8 = Curl_timediff(newer,cVar14);
        if ((long)(ulong)*(uint *)((long)pvVar4 + 0xa4) <= tVar8) {
          if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
            pcVar6 = (data->state).feat;
            if (pcVar6 == (curl_trc_feat *)0x0) {
              if (cf != (Curl_cfilter *)0x0) goto LAB_00115084;
            }
            else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar6->log_level)) {
LAB_00115084:
              if (0 < cf->cft->log_level) {
                Curl_trc_cf_infof(data,cf,"hard timeout of %dms reached, starting %s",
                                  (ulong)*(uint *)((long)pvVar4 + 0xa4),
                                  *(undefined8 *)((long)pvVar4 + 0x60));
              }
            }
          }
          goto LAB_001150a5;
        }
        if ((long)(ulong)*(uint *)((long)pvVar4 + 0xa0) <= tVar8) {
          plVar5 = *(long **)((long)pvVar4 + 0x30);
          if ((plVar5 != (long *)0x0) && (*(int *)((long)pvVar4 + 0x50) < 0)) {
            (**(code **)(*plVar5 + 0x70))(plVar5,data,2,(long)pvVar4 + 0x50,0);
          }
          if (*(int *)((long)pvVar4 + 0x50) < 0) {
            if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
              pcVar6 = (data->state).feat;
              if (pcVar6 == (curl_trc_feat *)0x0) {
                if (cf != (Curl_cfilter *)0x0) goto LAB_001152a7;
              }
              else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar6->log_level)) {
LAB_001152a7:
                if (0 < cf->cft->log_level) {
                  Curl_trc_cf_infof(data,cf,
                                    "soft timeout of %dms reached, %s has not seen any data, starting %s"
                                    ,(ulong)*(uint *)((long)pvVar4 + 0xa0),
                                    *(undefined8 *)((long)pvVar4 + 0x28),
                                    *(undefined8 *)((long)pvVar4 + 0x60));
                }
              }
            }
            goto LAB_001150a5;
          }
          Curl_expire(data,(ulong)*(uint *)((long)pvVar4 + 0xa4) - tVar8,EXPIRE_ALPN_EYEBALLS);
        }
      }
      else {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
          pcVar6 = (data->state).feat;
          if (pcVar6 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_0011502c;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar6->log_level)) {
LAB_0011502c:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"all previous attempts failed, starting %s",
                                *(undefined8 *)((long)pvVar4 + 0x60));
            }
          }
        }
LAB_001150a5:
        cf_hc_baller_init((cf_hc_baller *)(pCVar1 + 0x18),cf,data,(uint)cf->conn->transport);
      }
LAB_001150c4:
      if (((CURLE_UNSUPPORTED_PROTOCOL < (ulong)*(undefined8 *)(pCVar1 + 0x26)) &&
          (*(undefined8 *)(pCVar1 + 0x1a) != CURLE_OK)) && (pCVar1[0x1c] == CURLE_OK)) {
        winner = (cf_hc_baller *)(pCVar1 + 0x18);
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
          pcVar6 = (data->state).feat;
          if (pcVar6 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_0011511d;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar6->log_level)) {
LAB_0011511d:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"connect, check %s");
            }
          }
        }
        pCVar2 = cf->next;
        pCVar3 = *(Curl_cfilter **)(pCVar1 + 0x1a);
        cf->next = pCVar3;
        CVar7 = Curl_conn_cf_connect(pCVar3,data,done);
        pCVar1[0x1c] = CVar7;
        *(Curl_cfilter **)(pCVar1 + 0x1a) = cf->next;
        cf->next = pCVar2;
        if ((CVar7 == CURLE_OK) && (CVar7 = CURLE_OK, *done == true)) goto LAB_00115182;
      }
      uVar9 = *(undefined8 *)(pCVar1 + 0x26);
      if (uVar9 == CURLE_OK) {
        uVar10 = CURLE_OK;
      }
      else {
        uVar10 = CURLE_OK;
        uVar13 = uVar9;
        pCVar11 = pCVar1;
        do {
          pCVar11 = pCVar11 + 0xe;
          uVar10 = (uVar10 + CURLE_UNSUPPORTED_PROTOCOL) - (ulong)(*pCVar11 == CURLE_OK);
          uVar13 = uVar13 - CURLE_UNSUPPORTED_PROTOCOL;
        } while (uVar13 != CURLE_OK);
      }
      if (uVar10 == uVar9) {
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
          pcVar6 = (data->state).feat;
          if (pcVar6 == (curl_trc_feat *)0x0) {
            if (cf != (Curl_cfilter *)0x0) goto LAB_001151ee;
          }
          else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar6->log_level)) {
LAB_001151ee:
            if (0 < cf->cft->log_level) {
              Curl_trc_cf_infof(data,cf,"connect, all attempts failed");
            }
          }
        }
        pCVar11 = pCVar1;
        for (uVar9 = *(undefined8 *)(pCVar1 + 0x26); CVar12 = CVar7, uVar9 != CURLE_OK;
            uVar9 = uVar9 - CURLE_UNSUPPORTED_PROTOCOL) {
          pCVar11 = pCVar11 + 0xe;
          CVar12 = *pCVar11;
          if (*pCVar11 != CURLE_OK) break;
        }
        *pCVar1 = CURLE_URL_MALFORMAT;
        break;
      }
      *done = false;
    }
    else {
      pCVar3 = cf->next;
      cf->next = pCVar2;
      CVar7 = Curl_conn_cf_connect(pCVar2,data,done);
      pCVar1[0xe] = CVar7;
      *(Curl_cfilter **)(pCVar1 + 0xc) = cf->next;
      cf->next = pCVar3;
      if ((CVar7 != CURLE_OK) || (CVar7 = CURLE_OK, *done != true)) goto LAB_00114f18;
      winner = (cf_hc_baller *)(pCVar1 + 10);
LAB_00115182:
      baller_connected(cf,data,winner);
    }
    CVar12 = CURLE_OK;
    break;
  case CURLE_FAILED_INIT:
    cf->field_0x24 = cf->field_0x24 | 1;
    *done = true;
    CVar12 = CURLE_OK;
    break;
  case CURLE_URL_MALFORMAT:
    CVar12 = pCVar1[8];
    cf->field_0x24 = cf->field_0x24 & 0xfe;
    *done = false;
  }
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) {
    pcVar6 = (data->state).feat;
    if (pcVar6 == (curl_trc_feat *)0x0) {
      if (cf == (Curl_cfilter *)0x0) {
        return CVar12;
      }
    }
    else {
      if (cf == (Curl_cfilter *)0x0) {
        return CVar12;
      }
      if (pcVar6->log_level < 1) {
        return CVar12;
      }
    }
    if (0 < cf->cft->log_level) {
      Curl_trc_cf_infof(data,cf,"connect -> %d, done=%d",(ulong)CVar12,(ulong)*done);
    }
  }
  return CVar12;
}

Assistant:

static CURLcode cf_hc_connect(struct Curl_cfilter *cf,
                              struct Curl_easy *data,
                              bool *done)
{
  struct cf_hc_ctx *ctx = cf->ctx;
  struct curltime now;
  CURLcode result = CURLE_OK;
  size_t i, failed_ballers;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  *done = FALSE;
  now = Curl_now();
  switch(ctx->state) {
  case CF_HC_INIT:
    DEBUGASSERT(!cf->next);
    for(i = 0; i < ctx->baller_count; i++)
      DEBUGASSERT(!ctx->ballers[i].cf);
    CURL_TRC_CF(data, cf, "connect, init");
    ctx->started = now;
    cf_hc_baller_init(&ctx->ballers[0], cf, data, cf->conn->transport);
    if(ctx->baller_count > 1) {
      Curl_expire(data, ctx->soft_eyeballs_timeout_ms, EXPIRE_ALPN_EYEBALLS);
      CURL_TRC_CF(data, cf, "set next attempt to start in %ums",
                  ctx->soft_eyeballs_timeout_ms);
    }
    ctx->state = CF_HC_CONNECT;
    FALLTHROUGH();

  case CF_HC_CONNECT:
    if(cf_hc_baller_is_active(&ctx->ballers[0])) {
      result = cf_hc_baller_connect(&ctx->ballers[0], cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->ballers[0]);
        goto out;
      }
    }

    if(time_to_start_next(cf, data, 1, now)) {
      cf_hc_baller_init(&ctx->ballers[1], cf, data, cf->conn->transport);
    }

    if((ctx->baller_count > 1) && cf_hc_baller_is_active(&ctx->ballers[1])) {
      CURL_TRC_CF(data, cf, "connect, check %s", ctx->ballers[1].name);
      result = cf_hc_baller_connect(&ctx->ballers[1], cf, data, done);
      if(!result && *done) {
        result = baller_connected(cf, data, &ctx->ballers[1]);
        goto out;
      }
    }

    failed_ballers = 0;
    for(i = 0; i < ctx->baller_count; i++) {
      if(ctx->ballers[i].result)
        ++failed_ballers;
    }

    if(failed_ballers == ctx->baller_count) {
      /* all have failed. we give up */
      CURL_TRC_CF(data, cf, "connect, all attempts failed");
      for(i = 0; i < ctx->baller_count; i++) {
        if(ctx->ballers[i].result) {
          result = ctx->ballers[i].result;
          break;
        }
      }
      ctx->state = CF_HC_FAILURE;
      goto out;
    }
    result = CURLE_OK;
    *done = FALSE;
    break;

  case CF_HC_FAILURE:
    result = ctx->result;
    cf->connected = FALSE;
    *done = FALSE;
    break;

  case CF_HC_SUCCESS:
    result = CURLE_OK;
    cf->connected = TRUE;
    *done = TRUE;
    break;
  }

out:
  CURL_TRC_CF(data, cf, "connect -> %d, done=%d", result, *done);
  return result;
}